

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# planar_functions.cc
# Opt level: O0

int ARGBRect(uint8_t *dst_argb,int dst_stride_argb,int dst_x,int dst_y,int width,int height,
            uint32_t value)

{
  int iVar1;
  int in_ECX;
  int in_EDX;
  int in_ESI;
  long in_RDI;
  int in_R8D;
  int in_R9D;
  _func_void_uint8_t_ptr_uint32_t_int *ARGBSetRow;
  int y;
  code *pcVar2;
  int local_28;
  int local_24;
  int local_20;
  int local_14;
  long local_10;
  int local_4;
  
  pcVar2 = ARGBSetRow_C;
  if ((((in_RDI == 0) || (in_R8D < 1)) || (in_R9D == 0)) || ((in_EDX < 0 || (in_ECX < 0)))) {
    local_4 = -1;
  }
  else {
    local_24 = in_R9D;
    local_14 = in_ESI;
    local_10 = in_RDI;
    if (in_R9D < 0) {
      local_24 = -in_R9D;
      local_10 = in_RDI + (local_24 + -1) * in_ESI;
      local_14 = -in_ESI;
    }
    local_10 = local_10 + (in_ECX * local_14 + in_EDX * 4);
    local_20 = in_R8D;
    if (local_14 == in_R8D << 2) {
      local_20 = local_24 * in_R8D;
      local_24 = 1;
      local_14 = 0;
    }
    iVar1 = libyuv::TestCpuFlag(0);
    if (iVar1 != 0) {
      pcVar2 = ARGBSetRow_X86;
    }
    for (local_28 = 0; local_28 < local_24; local_28 = local_28 + 1) {
      (*pcVar2)(local_10,ARGBSetRow._0_4_,local_20);
      local_10 = local_10 + local_14;
    }
    local_4 = 0;
  }
  return local_4;
}

Assistant:

LIBYUV_API
int ARGBRect(uint8_t* dst_argb,
             int dst_stride_argb,
             int dst_x,
             int dst_y,
             int width,
             int height,
             uint32_t value) {
  int y;
  void (*ARGBSetRow)(uint8_t * dst_argb, uint32_t value, int width) =
      ARGBSetRow_C;
  if (!dst_argb || width <= 0 || height == 0 || dst_x < 0 || dst_y < 0) {
    return -1;
  }
  if (height < 0) {
    height = -height;
    dst_argb = dst_argb + (height - 1) * dst_stride_argb;
    dst_stride_argb = -dst_stride_argb;
  }
  dst_argb += dst_y * dst_stride_argb + dst_x * 4;
  // Coalesce rows.
  if (dst_stride_argb == width * 4) {
    width *= height;
    height = 1;
    dst_stride_argb = 0;
  }

#if defined(HAS_ARGBSETROW_NEON)
  if (TestCpuFlag(kCpuHasNEON)) {
    ARGBSetRow = ARGBSetRow_Any_NEON;
    if (IS_ALIGNED(width, 4)) {
      ARGBSetRow = ARGBSetRow_NEON;
    }
  }
#endif
#if defined(HAS_ARGBSETROW_X86)
  if (TestCpuFlag(kCpuHasX86)) {
    ARGBSetRow = ARGBSetRow_X86;
  }
#endif
#if defined(HAS_ARGBSETROW_MMI)
  if (TestCpuFlag(kCpuHasMMI)) {
    ARGBSetRow = ARGBSetRow_Any_MMI;
    if (IS_ALIGNED(width, 4)) {
      ARGBSetRow = ARGBSetRow_MMI;
    }
  }
#endif
#if defined(HAS_ARGBSETROW_MSA)
  if (TestCpuFlag(kCpuHasMSA)) {
    ARGBSetRow = ARGBSetRow_Any_MSA;
    if (IS_ALIGNED(width, 4)) {
      ARGBSetRow = ARGBSetRow_MSA;
    }
  }
#endif

  // Set plane
  for (y = 0; y < height; ++y) {
    ARGBSetRow(dst_argb, value, width);
    dst_argb += dst_stride_argb;
  }
  return 0;
}